

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O2

void __thiscall
Gudhi::ripser::
Compressed_sparse_matrix_<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>
::append_column(Compressed_sparse_matrix_<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>
                *this)

{
  unsigned_long local_8;
  
  local_8 = (long)(this->entries).
                  super__Vector_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->entries).
                  super__Vector_base<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_entry_t>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&this->bounds,&local_8);
  return;
}

Assistant:

void append_column() { bounds.push_back(entries.size()); }